

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::AddAndOwn
          (SimpleDescriptorDatabase *this,FileDescriptorProto *file)

{
  bool bVar1;
  FileDescriptorProto *local_18;
  FileDescriptorProto *file_local;
  SimpleDescriptorDatabase *this_local;
  
  local_18 = file;
  file_local = (FileDescriptorProto *)this;
  std::
  vector<std::unique_ptr<google::protobuf::FileDescriptorProto_const,std::default_delete<google::protobuf::FileDescriptorProto_const>>,std::allocator<std::unique_ptr<google::protobuf::FileDescriptorProto_const,std::default_delete<google::protobuf::FileDescriptorProto_const>>>>
  ::emplace_back<google::protobuf::FileDescriptorProto_const*&>
            ((vector<std::unique_ptr<google::protobuf::FileDescriptorProto_const,std::default_delete<google::protobuf::FileDescriptorProto_const>>,std::allocator<std::unique_ptr<google::protobuf::FileDescriptorProto_const,std::default_delete<google::protobuf::FileDescriptorProto_const>>>>
              *)&this->files_to_delete_,&local_18);
  bVar1 = DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
                    (&this->index_,local_18,local_18);
  return bVar1;
}

Assistant:

bool SimpleDescriptorDatabase::AddAndOwn(const FileDescriptorProto* file) {
  files_to_delete_.emplace_back(file);
  return index_.AddFile(*file, file);
}